

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::
argument_loader<kratos::SimulationRun*,std::unordered_map<kratos::Stmt*,unsigned_int,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<std::pair<kratos::Stmt*const,unsigned_int>>>const&>
::load_impl_sequence<0ul,1ul>
          (argument_loader<kratos::SimulationRun*,std::unordered_map<kratos::Stmt*,unsigned_int,std::hash<kratos::Stmt*>,std::equal_to<kratos::Stmt*>,std::allocator<std::pair<kratos::Stmt*const,unsigned_int>>>const&>
           *this,long call)

{
  bool bVar1;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x38),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if (bVar1) {
    bVar1 = map_caster<std::unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>,_kratos::Stmt_*,_unsigned_int>
            ::load((map_caster<std::unordered_map<kratos::Stmt_*,_unsigned_int,_std::hash<kratos::Stmt_*>,_std::equal_to<kratos::Stmt_*>,_std::allocator<std::pair<kratos::Stmt_*const,_unsigned_int>_>_>,_kratos::Stmt_*,_unsigned_int>
                    *)this,*(PyObject **)(*(long *)(call + 8) + 8),
                   SUB41((**(uint **)(call + 0x20) & 2) >> 1,0));
    return bVar1;
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }